

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyMemcmp(void *pB1,void *pB2,sxu32 nSize)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  
  if (nSize == 0) {
    return 0;
  }
  if (pB2 == (void *)0x0 || pB1 == (void *)0x0) {
    iVar2 = 1;
    if (pB1 == (void *)0x0) {
      iVar2 = -(uint)(pB2 != (void *)0x0);
    }
    return iVar2;
  }
  lVar3 = 0;
  while( true ) {
    bVar4 = *(byte *)((long)pB1 + lVar3);
    bVar1 = *(byte *)((long)pB2 + lVar3);
    if (bVar4 != bVar1) break;
    iVar2 = (int)lVar3;
    if (nSize - 1 == iVar2) {
      return 0;
    }
    bVar4 = *(byte *)((long)pB1 + lVar3 + 1);
    bVar1 = *(byte *)((long)pB2 + lVar3 + 1);
    if (bVar4 != bVar1) break;
    if (nSize - 2 == iVar2) {
      return 0;
    }
    bVar4 = *(byte *)((long)pB1 + lVar3 + 2);
    bVar1 = *(byte *)((long)pB2 + lVar3 + 2);
    if (bVar4 != bVar1) break;
    if (nSize - 3 == iVar2) {
      return 0;
    }
    bVar4 = *(byte *)((long)pB1 + lVar3 + 3);
    bVar1 = *(byte *)((long)pB2 + lVar3 + 3);
    if (bVar4 != bVar1) break;
    lVar3 = lVar3 + 4;
    if (nSize == (sxu32)lVar3) {
      return 0;
    }
  }
  return (uint)bVar4 - (uint)bVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyMemcmp(const void *pB1, const void *pB2, sxu32 nSize)
{
	sxi32 rc;
	if( nSize <= 0 ){
		return 0;
	}
	if( pB1 == 0 || pB2 == 0 ){
		return pB1 != 0 ? 1 : (pB2 == 0 ? 0 : -1);
	}
	SX_MACRO_FAST_CMP(pB1, pB2, nSize, rc);
	return rc;
}